

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

string * __thiscall
CLI::Formatter::make_option_usage_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,Option *opt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  pointer pcVar3;
  undefined8 uVar4;
  ostream *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  long lVar7;
  char *pcVar8;
  stringstream out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  (*(this->super_FormatterBase)._vptr_FormatterBase[0xc])(&local_1f0,this,opt,1);
  this_00 = local_1a0;
  ::std::__ostream_insert<char,std::char_traits<char>>
            (this_00,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  paVar1 = &local_1f0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if (opt->expected_max_ < 0x20000000) {
    if (opt->expected_max_ < 2) goto LAB_00191d8c;
    ::std::__ostream_insert<char,std::char_traits<char>>(this_00,"(",1);
    this_00 = (ostream *)::std::ostream::operator<<(this_00,opt->expected_min_);
    lVar7 = 2;
    pcVar8 = "x)";
  }
  else {
    lVar7 = 3;
    pcVar8 = "...";
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(this_00,pcVar8,lVar7);
LAB_00191d8c:
  bVar2 = (opt->super_OptionBase<CLI::Option>).required_;
  if (bVar2 == true) {
    ::std::__cxx11::stringbuf::str();
  }
  else {
    ::std::__cxx11::stringbuf::str();
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_1d0,0,0,"[",1);
    local_1f0._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
    paVar6 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p == paVar6) {
      local_1f0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_1f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1f0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    }
    local_1f0._M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_1f0,"]");
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (pbVar5->_M_dataplus)._M_p;
    paVar6 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 == paVar6) {
      uVar4 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar6->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar6->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
  }
  if (bVar2 == false) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  ::std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_option_usage(const Option *opt) const {
    // Note that these are positionals usages
    std::stringstream out;
    out << make_option_name(opt, true);
    if(opt->get_expected_max() >= detail::expected_max_vector_size)
        out << "...";
    else if(opt->get_expected_max() > 1)
        out << "(" << opt->get_expected() << "x)";

    return opt->get_required() ? out.str() : "[" + out.str() + "]";
}